

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int *piVar4;
  ulong uVar5;
  Mat *pMVar6;
  void *pvVar7;
  long *in_RSI;
  long in_RDI;
  Mat dst_1;
  Mat src_1;
  int q_3;
  float *beta_1;
  float *alpha_1;
  int *yofs_1;
  int *xofs_1;
  int *buf_1;
  Mat dst;
  Mat src;
  int q_2;
  float *beta;
  float *alpha;
  int *yofs;
  int *xofs;
  int *buf;
  int in_x;
  int x;
  int in_y;
  int y;
  float *outptr;
  float *ptr_1;
  int q_1;
  float ws;
  float hs;
  float *ptr;
  Mat top_blob_c;
  int q;
  int outw;
  int outh;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffd00;
  Mat *pMVar8;
  Mat *in_stack_fffffffffffffd08;
  Mat *in_stack_fffffffffffffd10;
  Mat *in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  float local_2d8;
  float local_2d4;
  int local_23c;
  int local_18c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  Mat *in_stack_fffffffffffffec0;
  Mat *local_100;
  Mat local_f8;
  Mat *local_b8;
  int local_b0;
  float local_ac;
  float local_a8;
  long local_98;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  int local_34;
  int local_30;
  int local_2c;
  long *local_18;
  int local_4;
  
  local_2c = *(int *)((long)in_RSI + 0x2c);
  local_30 = (int)in_RSI[6];
  local_34 = *(int *)((long)in_RSI + 0x34);
  local_40 = in_RSI[2];
  local_44 = *(int *)(in_RDI + 200);
  local_48 = *(int *)(in_RDI + 0xc4);
  if ((int)in_RSI[5] == 1) {
    local_30 = 1;
    local_2c = 1;
    local_34 = *(int *)((long)in_RSI + 0x2c);
  }
  if ((local_44 == 0) || (local_48 == 0)) {
    local_44 = (int)((float)local_30 * *(float *)(in_RDI + 0xc0));
    local_48 = (int)((float)local_2c * *(float *)(in_RDI + 0xbc));
  }
  if ((local_44 == local_30) && (local_48 == local_2c)) {
    Mat::operator=(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    Mat::create(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                (int)in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                (size_t)in_stack_fffffffffffffd08,(Allocator *)in_stack_fffffffffffffd00);
    bVar3 = Mat::empty(in_stack_fffffffffffffd00);
    if (bVar3) {
      local_4 = -100;
    }
    else if ((int)local_18[5] == 1) {
      for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
        Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
        local_98 = *local_18 + (long)local_4c * 4;
        Mat::fill(in_stack_fffffffffffffd10,(float)((ulong)in_stack_fffffffffffffd08 >> 0x20));
        Mat::~Mat((Mat *)0x1af573);
      }
      local_4 = 0;
    }
    else {
      if (*(int *)(in_RDI + 0xb8) == 1) {
        if (*(int *)(in_RDI + 200) == 0) {
          local_2d4 = 1.0 / *(float *)(in_RDI + 0xc0);
        }
        else {
          local_2d4 = (float)local_30 / (float)*(int *)(in_RDI + 200);
        }
        local_a8 = local_2d4;
        if (*(int *)(in_RDI + 0xc4) == 0) {
          local_2d8 = 1.0 / *(float *)(in_RDI + 0xbc);
        }
        else {
          local_2d8 = (float)local_2c / (float)*(int *)(in_RDI + 0xc4);
        }
        local_ac = local_2d8;
        for (local_b0 = 0; local_b0 < local_34; local_b0 = local_b0 + 1) {
          in_stack_fffffffffffffd18 = &local_f8;
          Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
          in_stack_fffffffffffffd20 = (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffffd18)
          ;
          Mat::~Mat((Mat *)0x1af6e3);
          in_stack_fffffffffffffd08 = (Mat *)&stack0xfffffffffffffec0;
          local_b8 = in_stack_fffffffffffffd20;
          Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
          in_stack_fffffffffffffd10 = (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffffd08)
          ;
          Mat::~Mat((Mat *)0x1af72f);
          local_100 = in_stack_fffffffffffffd10;
          for (in_stack_fffffffffffffebc = 0; in_stack_fffffffffffffebc < local_44;
              in_stack_fffffffffffffebc = in_stack_fffffffffffffebc + 1) {
            in_stack_fffffffffffffeb4 = (int)((float)in_stack_fffffffffffffebc * local_a8);
            in_stack_fffffffffffffeb0 = local_30 + -1;
            piVar4 = std::min<int>((int *)&stack0xfffffffffffffeb4,(int *)&stack0xfffffffffffffeb0);
            in_stack_fffffffffffffeb8 = *piVar4;
            for (in_stack_fffffffffffffeac = 0; in_stack_fffffffffffffeac < local_48;
                in_stack_fffffffffffffeac = in_stack_fffffffffffffeac + 1) {
              in_stack_fffffffffffffea4 = (int)((float)in_stack_fffffffffffffeac * local_ac);
              in_stack_fffffffffffffea0 = local_2c + -1;
              piVar4 = std::min<int>((int *)&stack0xfffffffffffffea4,(int *)&stack0xfffffffffffffea0
                                    );
              in_stack_fffffffffffffea8 = *piVar4;
              *(float *)&local_100->data =
                   *(float *)((long)&local_b8->data +
                             (long)(in_stack_fffffffffffffeb8 * local_2c + in_stack_fffffffffffffea8
                                   ) * 4);
              local_100 = (Mat *)((long)&local_100->data + 4);
            }
          }
        }
      }
      if (*(int *)(in_RDI + 0xb8) == 2) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(local_48 * 3 + local_44 * 3);
        uVar5 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        pMVar6 = (Mat *)operator_new__(uVar5);
        linear_coeffs((int)((ulong)in_stack_fffffffffffffd20 >> 0x20),(int)in_stack_fffffffffffffd20
                      ,(int *)in_stack_fffffffffffffd18,(float *)in_stack_fffffffffffffd10);
        linear_coeffs((int)((ulong)in_stack_fffffffffffffd20 >> 0x20),(int)in_stack_fffffffffffffd20
                      ,(int *)in_stack_fffffffffffffd18,(float *)in_stack_fffffffffffffd10);
        pMVar8 = in_stack_fffffffffffffd00;
        in_stack_fffffffffffffd00 = pMVar6;
        for (local_18c = 0; local_18c < local_34; local_18c = local_18c + 1) {
          Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)pMVar8 >> 0x20));
          Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)pMVar8 >> 0x20));
          resize_bilinear_image
                    (in_stack_fffffffffffffec0,
                     (Mat *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                     (float *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (float *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int *)in_stack_fffffffffffffd00);
          Mat::~Mat((Mat *)0x1afac9);
          Mat::~Mat((Mat *)0x1afad6);
        }
        if (in_stack_fffffffffffffd00 != (Mat *)0x0) {
          operator_delete__(in_stack_fffffffffffffd00);
        }
      }
      if (*(int *)(in_RDI + 0xb8) == 3) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = (long)(local_48 * 5 + local_44 * 5);
        uVar5 = SUB168(auVar2 * ZEXT816(4),0);
        if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        pvVar7 = operator_new__(uVar5);
        cubic_coeffs((int)((ulong)in_stack_fffffffffffffd20 >> 0x20),(int)in_stack_fffffffffffffd20,
                     (int *)in_stack_fffffffffffffd18,(float *)in_stack_fffffffffffffd10);
        cubic_coeffs((int)((ulong)in_stack_fffffffffffffd20 >> 0x20),(int)in_stack_fffffffffffffd20,
                     (int *)in_stack_fffffffffffffd18,(float *)in_stack_fffffffffffffd10);
        for (local_23c = 0; local_23c < local_34; local_23c = local_23c + 1) {
          Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
          Mat::channel(in_stack_fffffffffffffd08,(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
          resize_bicubic_image
                    ((Mat *)dst_1._40_8_,(Mat *)dst_1.allocator,(float *)dst_1._24_8_,
                     (int *)dst_1.elemsize,(float *)dst_1.refcount,(int *)dst_1.data);
          Mat::~Mat((Mat *)0x1afd30);
          Mat::~Mat((Mat *)0x1afd3d);
        }
        if (pvVar7 != (void *)0x0) {
          operator_delete__(pvVar7);
        }
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outh = output_height;
    int outw = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        channels = bottom_blob.w;
    }
    if (outh == 0 || outw == 0)
    {
        outh = static_cast<int>(h * height_scale);
        outw = static_cast<int>(w * width_scale);
    }
    if (outh == h && outw == w)
    {
        top_blob = bottom_blob;
        return 0;
    }

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        const float hs = output_height ? h / (float)output_height : 1.f / height_scale;
        const float ws = output_width ? w / (float)output_width : 1.f / width_scale;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            for (int y = 0; y < outh; y++)
            {
                int in_y = std::min((int) (y * hs), (h - 1));
                for (int x = 0; x < outw; x++)
                {
                    int in_x = std::min((int) (x * ws), (w - 1));
                    *outptr++ = ptr[in_y * w + in_x];
                }
            }
        }
    }

    if (resize_type == 2)// bilinear
    {
        int* buf = new int[outw + outh + outw*2 + outh*2];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 2];
        float* beta = (float*)(buf + outw + outh + outw*2);//new float[outh * 2];

        linear_coeffs(w, outw, xofs, alpha);
        linear_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    if (resize_type == 3)// bicubic
    {
        int* buf = new int[outw + outh + outw*4 + outh*4];

        int* xofs = buf;//new int[outw];
        int* yofs = buf + outw;//new int[outh];

        float* alpha = (float*)(buf + outw + outh);//new float[outw * 4];
        float* beta = (float*)(buf + outw + outh + outw*4);//new float[outh * 4];

        cubic_coeffs(w, outw, xofs, alpha);
        cubic_coeffs(h, outh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;
    }

    return 0;
}